

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkService.cpp
# Opt level: O3

void __thiscall WorkerContext::operator()(WorkerContext *this)

{
  source_loc loc;
  logger *this_00;
  socklen_t __len;
  sockaddr *__addr;
  void *in_R8;
  socklen_t in_R9D;
  string_view trace;
  string_view trace_00;
  string_view trace_01;
  string_view_t fmt;
  string_view trace_02;
  string_view trace_03;
  string_view trace_04;
  string_view trace_05;
  string_view trace_06;
  string_view trace_07;
  Response response;
  socket_t worker;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> address;
  context_t context;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> request;
  NetAction local_cc;
  undefined1 local_c8 [16];
  socket_t local_b8;
  string local_a8;
  DatabaseSnapshot *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  context_t local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  zmq::context_t::context_t(&local_58,1,0x3ff);
  zmq::socket_t::socket_t(&local_b8,&local_58,3);
  __len = (socklen_t)(this->identity)._M_string_length;
  zmq::detail::socket_base::setsockopt
            (&local_b8.super_socket_base,5,(int)(this->identity)._M_dataplus._M_p,__len,in_R8,in_R9D
            );
  zmq::detail::socket_base::connect(&local_b8.super_socket_base,0x1fe148,__addr,__len);
  local_78._M_dataplus._M_p._0_4_ = 0;
  trace._M_str = 
  "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,21)"
  ;
  trace._M_len = 0x67;
  s_send<NetAction>(&local_b8,(NetAction *)&local_78,trace,0);
  local_80 = &this->snap;
  do {
    trace_00._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,26)"
    ;
    trace_00._M_len = 0x67;
    s_recv<std::__cxx11::string>(&local_78,&local_b8,trace_00);
    trace_05._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,28)"
    ;
    trace_05._M_len = 0x67;
    s_recv_padding(&local_b8,trace_05);
    trace_01._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,31)"
    ;
    trace_01._M_len = 0x67;
    s_recv<std::__cxx11::string>(&local_50,&local_b8,trace_01);
    local_c8._0_8_ =
         ((this->task).super__Optional_base<Task,_false,_false>._M_payload.
          super__Optional_payload<Task,_true,_false,_false>.super__Optional_payload_base<Task>.
          _M_payload._M_value.spec_)->id_;
    this_00 = spdlog::default_logger_raw();
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    loc.funcname = (char *)0x0;
    loc.filename = (char *)0x0;
    loc.line = 0;
    loc._12_4_ = 0;
    fmt.size_ = 0x14;
    fmt.data_ = "TASK: start [{}]: {}";
    spdlog::logger::log<unsigned_long,std::__cxx11::string>
              (this_00,loc,info,fmt,(unsigned_long *)local_c8,&local_50);
    dispatch_command_safe((string *)local_c8,(Task *)&local_50,(DatabaseSnapshot *)&this->task);
    Response::to_string_abi_cxx11_(&local_a8,(Response *)local_c8);
    local_cc = Response;
    trace_02._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,39)"
    ;
    trace_02._M_len = 0x67;
    s_send<NetAction>(&local_b8,&local_cc,trace_02,2);
    trace_06._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,40)"
    ;
    trace_06._M_len = 0x67;
    s_send_padding(&local_b8,trace_06,2);
    trace_03._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,41)"
    ;
    trace_03._M_len = 0x67;
    s_send<std::__cxx11::string>(&local_b8,&local_78,trace_03,2);
    trace_07._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,42)"
    ;
    trace_07._M_len = 0x67;
    s_send_padding(&local_b8,trace_07,2);
    trace_04._M_str =
         "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/NetworkService.cpp,43)"
    ;
    trace_04._M_len = 0x67;
    s_send<std::__cxx11::string>(&local_b8,&local_a8,trace_04,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_c8 + 8),local_c8[0]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_) !=
        &local_78.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_78._M_dataplus._M_p._4_4_,local_78._M_dataplus._M_p._0_4_),
                      local_78.field_2._M_allocated_capacity + 1);
    }
  } while( true );
}

Assistant:

[[noreturn]] void WorkerContext::operator()() {
    zmq::context_t context(1);
    zmq::socket_t worker(context, ZMQ_REQ);

    worker.setsockopt(ZMQ_IDENTITY, identity.c_str(), identity.length());
    worker.connect("ipc://backend.ipc");

    //  Tell backend we're ready for work
    s_send<NetAction>(&worker, NetAction::Ready, ZMQTRACE);

    for (;;) {
        //  Read and save all frames until we get an empty frame
        //  In this example there is only 1 but it could be more
        auto address{s_recv<std::string>(&worker, ZMQTRACE)};

        s_recv_padding(&worker, ZMQTRACE);

        //  Get request, send reply
        auto request{s_recv<std::string>(&worker, ZMQTRACE)};
        spdlog::info("TASK: start [{}]: {}", task->spec().id(), request);

        Response response = dispatch_command_safe(request, &*task, &snap);
        // Note: optionally add funny metadata to response here (like request
        // time, assigned worker, etc)
        std::string s = response.to_string();

        s_send<NetAction>(&worker, NetAction::Response, ZMQTRACE, ZMQ_SNDMORE);
        s_send_padding(&worker, ZMQTRACE, ZMQ_SNDMORE);
        s_send(&worker, address, ZMQTRACE, ZMQ_SNDMORE);
        s_send_padding(&worker, ZMQTRACE, ZMQ_SNDMORE);
        s_send(&worker, s, ZMQTRACE);
    }
}